

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void codeTableLocks(Parse *pParse)

{
  Vdbe *p_00;
  TableLock *pTVar1;
  int p1;
  TableLock *p;
  Vdbe *pVdbe;
  int i;
  Parse *pParse_local;
  
  p_00 = sqlite3GetVdbe(pParse);
  for (pVdbe._4_4_ = 0; pVdbe._4_4_ < pParse->nTableLock; pVdbe._4_4_ = pVdbe._4_4_ + 1) {
    pTVar1 = pParse->aTableLock + pVdbe._4_4_;
    sqlite3VdbeAddOp4(p_00,0x9f,pTVar1->iDb,pTVar1->iTab,(uint)pTVar1->isWriteLock,pTVar1->zLockName
                      ,-1);
  }
  return;
}

Assistant:

static void codeTableLocks(Parse *pParse){
  int i;
  Vdbe *pVdbe; 

  pVdbe = sqlite3GetVdbe(pParse);
  assert( pVdbe!=0 ); /* sqlite3GetVdbe cannot fail: VDBE already allocated */

  for(i=0; i<pParse->nTableLock; i++){
    TableLock *p = &pParse->aTableLock[i];
    int p1 = p->iDb;
    sqlite3VdbeAddOp4(pVdbe, OP_TableLock, p1, p->iTab, p->isWriteLock,
                      p->zLockName, P4_STATIC);
  }
}